

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSourceStats::ProcessPacket
          (RTPSourceStats *this,RTPPacket *pack,RTPTime *receivetime,double tsunit,bool ownpacket,
          bool *accept,bool applyprobation,bool *onprobation)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  *onprobation = false;
  if (this->sentdata == false) {
    if (applyprobation) {
      if (this->probation == 0) {
        this->probation = 2;
        this->prevseqnr = (uint16_t)pack->extseqnr;
LAB_0012e860:
        *onprobation = true;
        *accept = false;
        (this->lastmsgtime).m_t = receivetime->m_t;
        return;
      }
      uVar2 = pack->extseqnr;
      if (uVar2 != (*(int *)&this->prevseqnr + 1U & 0xffff)) {
        this->probation = 2;
        this->prevseqnr = (uint16_t)uVar2;
        goto LAB_0012e860;
      }
      this->prevseqnr = (uint16_t)uVar2;
      iVar5 = this->probation + -1;
      this->probation = iVar5;
      if (iVar5 != 0) goto LAB_0012e860;
      *accept = true;
      this->sentdata = true;
      this->packetsreceived = this->packetsreceived + 1;
      this->numnewpackets = this->numnewpackets + 1;
      if (uVar2 == 0) goto LAB_0012e811;
      this->baseseqnr = uVar2 - 1;
    }
    else {
      *accept = true;
      this->sentdata = true;
      this->packetsreceived = this->packetsreceived + 1;
      this->numnewpackets = this->numnewpackets + 1;
      if (pack->extseqnr == 0) {
LAB_0012e811:
        this->numcycles = 0x10000;
        this->baseseqnr = 0xffff;
      }
      else {
        this->baseseqnr = pack->extseqnr - 1;
      }
    }
    uVar2 = this->baseseqnr;
    this->exthighseqnr = uVar2 + 1;
    dVar6 = receivetime->m_t;
    (this->prevpacktime).m_t = dVar6;
    this->prevexthighseqnr = uVar2;
    this->savedextseqnr = uVar2;
    pack->extseqnr = uVar2 + 1;
    goto LAB_0012e8c5;
  }
  *accept = true;
  this->packetsreceived = this->packetsreceived + 1;
  this->numnewpackets = this->numnewpackets + 1;
  uVar1 = this->exthighseqnr;
  uVar3 = pack->extseqnr;
  if (uVar3 < (uVar1 & 0xffff)) {
    uVar2 = this->numcycles;
    if ((uVar3 - uVar1 & 0xffff) < (uVar1 - uVar3 & 0xffff)) {
      this->numcycles = uVar2 + 0x10000;
      uVar2 = uVar3 + uVar2 + 0x10000;
      goto LAB_0012e767;
    }
    uVar2 = uVar2 + uVar3;
  }
  else {
    uVar2 = uVar3 + this->numcycles;
LAB_0012e767:
    this->exthighseqnr = uVar2;
  }
  pack->extseqnr = uVar2;
  if (tsunit <= 0.0) {
    this->djitter = 0.0;
    uVar2 = 0;
  }
  else {
    uVar1 = pack->timestamp;
    uVar3 = this->prevtimestamp;
    uVar4 = uVar1 - uVar3;
    if (uVar1 < uVar3 || uVar4 == 0) {
      dVar6 = 0.0;
      if (uVar1 < uVar3) {
        uVar3 = uVar3 - uVar1;
        if (uVar3 < 0x10000000) {
          dVar6 = -(double)(int)uVar3;
        }
        else {
          dVar6 = (double)-uVar3;
        }
      }
    }
    else if (uVar4 < 0x10000000) {
      dVar6 = (double)(int)uVar4;
    }
    else {
      dVar6 = (double)((ulong)(double)-uVar4 | (ulong)DAT_00131ea0);
    }
    dVar6 = (receivetime->m_t - (this->prevpacktime).m_t) / tsunit - dVar6;
    dVar7 = -dVar6;
    if (-dVar6 <= dVar6) {
      dVar7 = dVar6;
    }
    dVar6 = (dVar7 - this->djitter) * 0.0625 + this->djitter;
    this->djitter = dVar6;
    uVar2 = (uint32_t)(long)dVar6;
  }
  this->jitter = uVar2;
  dVar6 = receivetime->m_t;
  (this->prevpacktime).m_t = dVar6;
LAB_0012e8c5:
  this->prevtimestamp = pack->timestamp;
  (this->lastmsgtime).m_t = dVar6;
  if (!ownpacket) {
    (this->lastrtptime).m_t = dVar6;
  }
  return;
}

Assistant:

void RTPSourceStats::ProcessPacket(RTPPacket *pack,const RTPTime &receivetime,double tsunit,
                                   bool ownpacket,bool *accept,bool applyprobation,bool *onprobation)
{
	JRTPLIB_UNUSED(applyprobation); // possibly unused

	// Note that the sequence number in the RTP packet is still just the
	// 16 bit number contained in the RTP header

	*onprobation = false;
	
	if (!sentdata) // no valid packets received yet
	{
#ifdef RTP_SUPPORT_PROBATION
		if (applyprobation)
		{
			bool acceptpack = false;

			if (probation)  
			{	
				uint16_t pseq;
				uint32_t pseq2;
	
				pseq = prevseqnr;
				pseq++;
				pseq2 = (uint32_t)pseq;
				if (pseq2 == pack->GetExtendedSequenceNumber()) // ok, its the next expected packet
				{
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					probation--;	
					if (probation == 0) // probation over
						acceptpack = true;
					else
						*onprobation = true;
				}
				else // not next packet
				{
					probation = RTP_PROBATIONCOUNT;
					prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();
					*onprobation = true;
				}
			}
			else // first packet received with this SSRC ID, start probation
			{
				probation = RTP_PROBATIONCOUNT;
				prevseqnr = (uint16_t)pack->GetExtendedSequenceNumber();	
				*onprobation = true;
			}
	
			if (acceptpack)
			{
				ACCEPTPACKETCODE
			}
			else
			{
				*accept = false;
				lastmsgtime = receivetime;
			}
		}
		else // No probation
		{
			ACCEPTPACKETCODE
		}
#else // No compiled-in probation support

		ACCEPTPACKETCODE

#endif // RTP_SUPPORT_PROBATION
	}
	else // already got packets
	{
		uint16_t maxseq16;
		uint32_t extseqnr;

		// Adjust max extended sequence number and set extende seq nr of packet

		*accept = true;
		packetsreceived++;
		numnewpackets++;

		maxseq16 = (uint16_t)(exthighseqnr&0x0000FFFF);
		if (pack->GetExtendedSequenceNumber() >= maxseq16)
		{
			extseqnr = numcycles+pack->GetExtendedSequenceNumber();
			exthighseqnr = extseqnr;
		}
		else
		{
			uint16_t dif1,dif2;

			dif1 = ((uint16_t)pack->GetExtendedSequenceNumber());
			dif1 -= maxseq16;
			dif2 = maxseq16;
			dif2 -= ((uint16_t)pack->GetExtendedSequenceNumber());
			if (dif1 < dif2)
			{
				numcycles += 0x00010000;
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
				exthighseqnr = extseqnr;
			}
			else
				extseqnr = numcycles+pack->GetExtendedSequenceNumber();
		}

		pack->SetExtendedSequenceNumber(extseqnr);

		// Calculate jitter

		if (tsunit > 0)
		{
#if 0
			RTPTime curtime = receivetime;
			double diffts1,diffts2,diff;

			curtime -= prevpacktime;
			diffts1 = curtime.GetDouble()/tsunit;	
			diffts2 = (double)pack->GetTimestamp() - (double)prevtimestamp;
			diff = diffts1 - diffts2;
			if (diff < 0)
				diff = -diff;
			diff -= djitter;
			diff /= 16.0;
			djitter += diff;
			jitter = (uint32_t)djitter;
#else
RTPTime curtime = receivetime;
double diffts1,diffts2,diff;
uint32_t curts = pack->GetTimestamp();

curtime -= prevpacktime;
diffts1 = curtime.GetDouble()/tsunit;	

if (curts > prevtimestamp)
{
	uint32_t unsigneddiff = curts - prevtimestamp;

	if (unsigneddiff < 0x10000000) // okay, curts realy is larger than prevtimestamp
		diffts2 = (double)unsigneddiff;
	else
	{
		// wraparound occurred and curts is actually smaller than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = -((double)unsigneddiff);
	}
}
else if (curts < prevtimestamp)
{
	uint32_t unsigneddiff = prevtimestamp - curts;

	if (unsigneddiff < 0x10000000) // okay, curts really is smaller than prevtimestamp
		diffts2 = -((double)unsigneddiff); // negative since we actually need curts-prevtimestamp
	else
	{
		// wraparound occurred and curts is actually larger than prevtimestamp

		unsigneddiff = -unsigneddiff; // to get the actual difference (in absolute value)
		diffts2 = (double)unsigneddiff;
	}
}
else
	diffts2 = 0;

diff = diffts1 - diffts2;
if (diff < 0)
	diff = -diff;
diff -= djitter;
diff /= 16.0;
djitter += diff;
jitter = (uint32_t)djitter;
#endif
		}
		else
		{
			djitter = 0;
			jitter = 0;
		}

		prevpacktime = receivetime;
		prevtimestamp = pack->GetTimestamp();
		lastmsgtime = prevpacktime;
		if (!ownpacket) // for own packet, this value is set on an outgoing packet
			lastrtptime = prevpacktime;
	}
}